

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O3

errr Term_text_x11(wchar_t x,wchar_t y,wchar_t n,wchar_t a,wchar_t *s)

{
  void *pvVar1;
  wchar_t wVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  sVar3 = (size_t)(uint)n;
  wVar2 = a + L'ÿ';
  if (L'\xffffffff' < a) {
    wVar2 = a;
  }
  Infoclr = clr[a % 0x20 + (wVar2 >> 8) * 0x20];
  if ((s != (wchar_t *)0x0) && (*s != L'\0')) {
    pvVar1 = Term->data;
    if (n < L'\0') {
      sVar3 = wcslen(s);
    }
    iVar5 = (int)Infowin->oy + y * *(int *)((long)pvVar1 + 0xf0);
    iVar4 = (int)Infowin->ox + x * *(int *)((long)pvVar1 + 0xe8);
    XFillRectangle(metadpy_default_0,Infowin->win,clr[0]->gc,iVar4,iVar5,
                   *(int *)((long)pvVar1 + 0xe8) * (int)sVar3,*(int *)((long)pvVar1 + 0xf0));
    iVar5 = Infofnt->asc + iVar5;
    if ((Infofnt->field_0x19 & 1) == 0) {
      XwcDrawImageString(metadpy_default_0,Infowin->win,Infofnt->fs,Infoclr->gc,iVar4,iVar5,s,sVar3)
      ;
    }
    else if (0 < (int)sVar3) {
      uVar6 = 0;
      do {
        XwcDrawImageString(metadpy_default_0,Infowin->win,Infofnt->fs,Infoclr->gc,
                           (uint)Infofnt->off + *(int *)((long)pvVar1 + 0xe8) * (int)uVar6 + iVar4,
                           iVar5,s,1);
        uVar6 = uVar6 + 1;
        s = s + 1;
      } while ((sVar3 & 0xffffffff) != uVar6);
    }
  }
  return 0;
}

Assistant:

static errr Term_text_x11(int x, int y, int n, int a, const wchar_t *s)
{
	/* Draw the text */
	Infoclr_set(clr[(a / MULT_BG) * MAX_COLORS + (a % MAX_COLORS)]);

	/* Draw the text */
	Infofnt_text_std(x, y, s, n);

	/* Success */
	return (0);
}